

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_app.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  Option *pOVar2;
  ostream *poVar3;
  int v;
  int count;
  double value;
  bool output;
  string file;
  App app;
  int local_5a8;
  int local_5a4;
  double local_5a0;
  undefined1 local_598 [72];
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  App local_390;
  
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3b0,"configuration print example","");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"");
  CLI::App::App(&local_390,&local_3b0,&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"-p,--print","");
  pOVar2 = CLI::App::add_flag<const_char[29],_(CLI::detail::enabler)0>
                     (&local_390,&local_3f0,(char (*) [29])"Print configuration and exit");
  (pOVar2->super_OptionBase<CLI::Option>).configurable_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  local_598._40_8_ = local_598 + 0x38;
  local_598._48_8_ = 0;
  local_598[0x38] = '\0';
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"-f,--file,file","");
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"File name","");
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (&local_390,&local_410,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_598 + 0x28),&local_430);
  pOVar2 = CLI::Option::capture_default_str(pOVar2);
  pOVar2->run_callback_for_default_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  local_5a4 = 0;
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"-c,--count","");
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"Counter","");
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (&local_390,&local_450,&local_5a4,&local_470);
  CLI::Option::capture_default_str(pOVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p);
  }
  local_5a8 = 0;
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"--flag","");
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4b0,"Some flag that can be passed multiple times","");
  pOVar2 = CLI::App::add_flag<int,_(CLI::detail::enabler)0>
                     (&local_390,&local_490,&local_5a8,&local_4b0);
  local_598._32_8_ = CLI::Option::capture_default_str(pOVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p);
  }
  local_5a0 = 0.0;
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"-d,--double","");
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"Some Value","");
  pOVar2 = CLI::App::add_option<double,_double,_(CLI::detail::enabler)0>
                     (&local_390,&local_4d0,&local_5a0,&local_4f0);
  CLI::Option::capture_default_str(pOVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p);
  }
  CLI::App::get_config_formatter_base((App *)local_598);
  *(undefined2 *)(CONCAT71(local_598._1_7_,local_598[0]) + 0x25) = 0x2222;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._8_8_);
  }
  CLI::App::parse_char_t<char>(&local_390,argc,argv);
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"--print","");
  pOVar2 = CLI::App::get_option(&local_390,&local_510);
  CLI::Option::results<bool>(pOVar2,(bool *)local_598);
  bVar1 = local_598[0];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p);
  }
  if (bVar1 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Working on file: ",0x11);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_598._40_8_,local_598._48_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", direct count: ",0x10);
    local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"--file","");
    CLI::App::count(&local_390,&local_530);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", opt count: ",0xd);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    local_598[0] = true;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_598,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._M_dataplus._M_p != &local_530.field_2) {
      operator_delete(local_530._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Working on count: ",0x12);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_5a4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", direct count: ",0x10);
    local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"--count","");
    CLI::App::count(&local_390,&local_550);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", opt count: ",0xd);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    local_598[0] = true;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_598,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550._M_dataplus._M_p != &local_550.field_2) {
      operator_delete(local_550._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Received flag: ",0xf);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_5a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") times\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Some value: ",0xc);
    poVar3 = std::ostream::_M_insert<double>(local_5a0);
    local_598[0] = true;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_598,1);
  }
  else {
    CLI::App::config_to_str_abi_cxx11_((string *)local_598,&local_390,true,false);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)CONCAT71(local_598._1_7_,local_598[0]),local_598._8_8_)
    ;
    if ((undefined1 *)CONCAT71(local_598._1_7_,local_598[0]) != local_598 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_598._1_7_,local_598[0]));
    }
  }
  if ((undefined1 *)local_598._40_8_ != local_598 + 0x38) {
    operator_delete((void *)local_598._40_8_);
  }
  CLI::App::~App(&local_390);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    CLI::App app("configuration print example");

    app.add_flag("-p,--print", "Print configuration and exit")->configurable(false);  // NEW: print flag

    std::string file;
    CLI::Option *opt = app.add_option("-f,--file,file", file, "File name")
                           ->capture_default_str()
                           ->run_callback_for_default();  // NEW: capture_default_str()

    int count{0};
    CLI::Option *copt =
        app.add_option("-c,--count", count, "Counter")->capture_default_str();  // NEW: capture_default_str()

    int v{0};
    CLI::Option *flag = app.add_flag("--flag", v, "Some flag that can be passed multiple times")
                            ->capture_default_str();  // NEW: capture_default_str()

    double value{0.0};                                                          // = 3.14;
    app.add_option("-d,--double", value, "Some Value")->capture_default_str();  // NEW: capture_default_str()

    app.get_config_formatter_base()->quoteCharacter('"', '"');

    CLI11_PARSE(app, argc, argv);

    if(app.get_option("--print")->as<bool>()) {  // NEW: print configuration and exit
        std::cout << app.config_to_str(true, false);
        return 0;
    }

    std::cout << "Working on file: " << file << ", direct count: " << app.count("--file")
              << ", opt count: " << opt->count() << '\n';
    std::cout << "Working on count: " << count << ", direct count: " << app.count("--count")
              << ", opt count: " << copt->count() << '\n';
    std::cout << "Received flag: " << v << " (" << flag->count() << ") times\n";
    std::cout << "Some value: " << value << '\n';

    return 0;
}